

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *context)

{
  wchar_t wVar1;
  monster *mon_00;
  short local_f0;
  _Bool local_e9;
  monster_conflict *local_e8;
  char local_d8 [7];
  _Bool seen;
  char m_poss [80];
  char m_name [80];
  wchar_t amount;
  monster *mon;
  wchar_t midx;
  effect_handler_context_t *context_local;
  
  if ((context->origin).what != SRC_MONSTER) {
    __assert_fail("context->origin.what == SRC_MONSTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-attack.c"
                  ,0x146,"_Bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *)");
  }
  wVar1 = (context->origin).which.monster;
  if (wVar1 < L'\x01') {
    local_e8 = (monster_conflict *)0x0;
  }
  else {
    local_e8 = cave_monster(cave,wVar1);
  }
  if (local_e8 != (monster_conflict *)0x0) {
    wVar1 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
    mon_00 = choose_nearby_injured_kin((chunk *)cave,(monster *)local_e8);
    if (mon_00 != (monster *)0x0) {
      monster_desc(m_poss + 0x48,0x50,mon_00,L'̔');
      monster_desc(local_d8,0x50,mon_00,L'\"');
      local_e9 = false;
      if (player->timed[2] == 0) {
        local_e9 = monster_is_visible(mon_00);
      }
      if ((int)mon_00->maxhp < mon_00->hp + wVar1) {
        local_f0 = mon_00->maxhp;
      }
      else {
        local_f0 = mon_00->hp + (short)wVar1;
      }
      mon_00->hp = local_f0;
      if (local_e9 != false) {
        if (mon_00->hp == mon_00->maxhp) {
          msg("%s looks REALLY healthy!",m_poss + 0x48);
        }
        else if (local_e9 != false) {
          msg("%s looks healthier.",m_poss + 0x48);
        }
      }
      if (player->upkeep->health_who == mon_00) {
        player->upkeep->redraw = player->upkeep->redraw | 0x200;
      }
      if (mon_00->m_timed[3] != 0) {
        mon_clear_timed(mon_00,L'\x03',L'\x04');
        msg("%s recovers %s courage.",m_poss + 0x48,local_d8);
      }
      context->ident = true;
    }
  }
  return true;
}

Assistant:

bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int midx = context->origin.which.monster;
	struct monster *mon = midx > 0 ? cave_monster(cave, midx) : NULL;
	if (!mon) return true;

	int amount = effect_calculate_value(context, false);
	char m_name[80], m_poss[80];
	bool seen;

	/* Find a nearby monster */
	mon = choose_nearby_injured_kin(cave, mon);
	if (!mon) return true;

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the monster possessive ("his"/"her"/"its") */
	monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

	seen = (!player->timed[TMD_BLIND] && monster_is_visible(mon));

	/* Heal some */
	mon->hp = MIN(mon->hp + amount, mon->maxhp);

	if (seen) {
		if (mon->hp == mon->maxhp) {
			msg("%s looks REALLY healthy!", m_name);
		} else if (seen) { /* Partially healed */
			msg("%s looks healthier.", m_name);
		}
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Cancel fear */
	if (mon->m_timed[MON_TMD_FEAR]) {
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		msg("%s recovers %s courage.", m_name, m_poss);
	}

	/* ID */
	context->ident = true;

	return true;
}